

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_errmsg(sqlite3 *db)

{
  int iVar1;
  sqlite3 *local_20;
  char *z;
  sqlite3 *db_local;
  
  if (db == (sqlite3 *)0x0) {
    db_local = (sqlite3 *)sqlite3ErrStr(7);
  }
  else {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar1 == 0) {
      iVar1 = sqlite3MisuseError(0x1c793);
      db_local = (sqlite3 *)sqlite3ErrStr(iVar1);
    }
    else {
      sqlite3_mutex_enter(db->mutex);
      if (db->mallocFailed == '\0') {
        local_20 = (sqlite3 *)sqlite3_value_text(db->pErr);
        if (local_20 == (sqlite3 *)0x0) {
          local_20 = (sqlite3 *)sqlite3ErrStr(db->errCode);
        }
      }
      else {
        local_20 = (sqlite3 *)sqlite3ErrStr(7);
      }
      sqlite3_mutex_leave(db->mutex);
      db_local = local_20;
    }
  }
  return (char *)db_local;
}

Assistant:

SQLITE_API const char *sqlite3_errmsg(sqlite3 *db){
  const char *z;
  if( !db ){
    return sqlite3ErrStr(SQLITE_NOMEM);
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return sqlite3ErrStr(SQLITE_MISUSE_BKPT);
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = sqlite3ErrStr(SQLITE_NOMEM);
  }else{
    z = (char*)sqlite3_value_text(db->pErr);
    assert( !db->mallocFailed );
    if( z==0 ){
      z = sqlite3ErrStr(db->errCode);
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}